

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::makeDebugFunction(Builder *this,Function *function,Id nameId,Id funcTypeId)

{
  Id typeId;
  Id IVar1;
  mapped_type_conflict *pmVar2;
  Instruction *pIVar3;
  value_type local_38;
  Instruction *local_30;
  Instruction *type;
  Id local_20;
  Id funcId;
  Id funcTypeId_local;
  Id nameId_local;
  Function *function_local;
  Builder *this_local;
  
  local_20 = funcTypeId;
  funcId = nameId;
  _funcTypeId_local = function;
  function_local = (Function *)this;
  if (function == (Function *)0x0) {
    __assert_fail("function != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x945,"Id spv::Builder::makeDebugFunction(Function *, Id, Id)");
  }
  if (nameId == 0) {
    __assert_fail("nameId != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x946,"Id spv::Builder::makeDebugFunction(Function *, Id, Id)");
  }
  if (funcTypeId == 0) {
    __assert_fail("funcTypeId != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x947,"Id spv::Builder::makeDebugFunction(Function *, Id, Id)");
  }
  pmVar2 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&this->debugId,&local_20);
  if (*pmVar2 != 0) {
    type._4_4_ = getUniqueId(this);
    pIVar3 = (Instruction *)::operator_new(0x60);
    IVar1 = type._4_4_;
    typeId = makeVoidType(this);
    spv::Instruction::Instruction(pIVar3,IVar1,typeId,OpExtInst);
    local_30 = pIVar3;
    spv::Instruction::reserveOperands(pIVar3,0xb);
    spv::Instruction::addIdOperand(local_30,this->nonSemanticShaderDebugInfo);
    spv::Instruction::addImmediateOperand(local_30,0x14);
    spv::Instruction::addIdOperand(local_30,funcId);
    pIVar3 = local_30;
    pmVar2 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->debugId,&local_20);
    spv::Instruction::addIdOperand(pIVar3,*pmVar2);
    pIVar3 = local_30;
    IVar1 = makeDebugSource(this,this->currentFileId);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = local_30;
    IVar1 = makeUintConstant(this,this->currentLine,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = local_30;
    IVar1 = makeUintConstant(this,0,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = local_30;
    IVar1 = makeDebugCompilationUnit(this);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    spv::Instruction::addIdOperand(local_30,funcId);
    pIVar3 = local_30;
    IVar1 = makeUintConstant(this,3,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = local_30;
    IVar1 = makeUintConstant(this,this->currentLine,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_38,
               local_30);
    std::
    vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::push_back(&this->constantsTypesGlobals,&local_38);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_38);
    Module::mapInstruction(&this->module,local_30);
    return type._4_4_;
  }
  __assert_fail("debugId[funcTypeId] != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0x948,"Id spv::Builder::makeDebugFunction(Function *, Id, Id)");
}

Assistant:

Id Builder::makeDebugFunction([[maybe_unused]] Function* function, Id nameId, Id funcTypeId)
{
    assert(function != nullptr);
    assert(nameId != 0);
    assert(funcTypeId != 0);
    assert(debugId[funcTypeId] != 0);

    Id funcId = getUniqueId();
    auto type = new Instruction(funcId, makeVoidType(), OpExtInst);
    type->reserveOperands(11);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugFunction);
    type->addIdOperand(nameId);
    type->addIdOperand(debugId[funcTypeId]);
    type->addIdOperand(makeDebugSource(currentFileId)); // TODO: This points to file of definition instead of declaration
    type->addIdOperand(makeUintConstant(currentLine)); // TODO: This points to line of definition instead of declaration
    type->addIdOperand(makeUintConstant(0)); // column
    type->addIdOperand(makeDebugCompilationUnit()); // scope
    type->addIdOperand(nameId); // linkage name
    type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100FlagIsPublic));
    type->addIdOperand(makeUintConstant(currentLine)); 
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);
    return funcId;
}